

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboColorMultiTex2DCase::render(FboColorMultiTex2DCase *this,Surface *dst)

{
  ContextWrapper *pCVar1;
  deUint32 dVar2;
  ContextWrapper *this_00;
  bool bVar3;
  int i_2;
  DataType DVar4;
  deUint32 program;
  deUint32 program_00;
  deUint32 program_01;
  int iVar5;
  Context *pCVar6;
  TextureFormat *pTVar7;
  TransferFormat TVar8;
  deUint32 *pdVar9;
  int i;
  long lVar10;
  deUint32 *textures;
  int iVar11;
  bool bVar12;
  Vector<float,_4> res_1;
  deUint32 tmpTex;
  Vec4 local_618;
  ContextWrapper *local_608;
  TextureFormat texFmt1;
  TextureFormat texFmt0;
  deUint32 tex1;
  deUint32 tex0;
  deUint32 fbo1;
  deUint32 fbo0;
  Vector<float,_4> res_3;
  void *local_5b8;
  Vec4 local_598;
  TextureFormatInfo fmtInfo1;
  TextureFormatInfo fmtInfo0;
  Texture2DShader multiTexShader;
  Texture2DShader texToFbo1Shader;
  Texture2DShader texToFbo0Shader;
  
  texFmt0 = glu::mapGLInternalFormat(*(deUint32 *)&(this->super_FboColorbufferCase).field_0x8c);
  texFmt1 = glu::mapGLInternalFormat(this->m_tex1Fmt);
  tcu::getTextureFormatInfo(&fmtInfo0,&texFmt0);
  tcu::getTextureFormatInfo(&fmtInfo1,&texFmt1);
  texToFbo1Shader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texToFbo1Shader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texToFbo1Shader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)
       CONCAT44(multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._4_4_,0x28)
  ;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&texToFbo1Shader,(iterator)0x0,
             (DataType *)&multiTexShader);
  DVar4 = FboTestUtil::getFragmentOutputType(&texFmt0);
  multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar10 = 0;
  do {
    *(float *)((long)&multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader +
              lVar10 * 4) = fmtInfo0.valueMax.m_data[lVar10] - fmtInfo0.valueMin.m_data[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFbo0Shader,(DataTypes *)&texToFbo1Shader,DVar4,(Vec4 *)&multiTexShader,
             &fmtInfo0.valueMin);
  if (texToFbo1Shader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0
     ) {
    operator_delete(texToFbo1Shader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)texToFbo1Shader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)texToFbo1Shader.super_ShaderProgram.super_VertexShader._vptr_VertexShader)
    ;
  }
  multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  res_1.m_data[0] = 5.60519e-44;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&multiTexShader,(iterator)0x0,
             (DataType *)&res_1);
  DVar4 = FboTestUtil::getFragmentOutputType(&texFmt1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar10 = 0;
  do {
    res_1.m_data[lVar10] = fmtInfo1.valueMax.m_data[lVar10] - fmtInfo1.valueMin.m_data[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFbo1Shader,(DataTypes *)&multiTexShader,DVar4,&res_1,&fmtInfo1.valueMin);
  if (multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0)
  {
    operator_delete(multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  res_3.m_data[0] = (float)glu::getSampler2DType(texFmt0);
  if (res_1.m_data._8_8_ == 0) {
    std::vector<glu::DataType,std::allocator<glu::DataType>>::
    _M_realloc_insert<glu::DataType_const&>
              ((vector<glu::DataType,std::allocator<glu::DataType>> *)&res_1,(iterator)0x0,
               (DataType *)&res_3);
  }
  else {
    *(float *)res_1.m_data._8_8_ = res_3.m_data[0];
    res_1.m_data._8_8_ = res_1.m_data._8_8_ + 4;
  }
  res_3.m_data[0] = (float)glu::getSampler2DType(texFmt1);
  if (res_1.m_data._8_8_ == 0) {
    std::vector<glu::DataType,std::allocator<glu::DataType>>::
    _M_realloc_insert<glu::DataType_const&>
              ((vector<glu::DataType,std::allocator<glu::DataType>> *)&res_1,(iterator)0x0,
               (DataType *)&res_3);
  }
  else {
    *(float *)res_1.m_data._8_8_ = res_3.m_data[0];
    res_1.m_data._8_8_ = res_1.m_data._8_8_ + 4;
  }
  lVar10 = 0;
  do {
    res_3.m_data[lVar10] = 1.0;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_618.m_data._0_8_ = (undefined1 *)0x0;
  local_618.m_data[2] = 0.0;
  local_618.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&multiTexShader,(DataTypes *)&res_1,TYPE_FLOAT_VEC4,&res_3,&local_618);
  if (res_1.m_data._0_8_ != 0) {
    operator_delete((void *)res_1.m_data._0_8_,-res_1.m_data._0_8_);
  }
  pCVar1 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  program = (*pCVar6->_vptr_Context[0x75])(pCVar6,&texToFbo0Shader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  program_00 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&texToFbo1Shader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  program_01 = (*pCVar6->_vptr_Context[0x75])(pCVar6);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar10 = 0;
  do {
    res_1.m_data[lVar10] = fmtInfo0.lookupScale.m_data[lVar10] * 0.5;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  res_3.m_data[2] = 0.0;
  res_3.m_data[3] = 0.0;
  lVar10 = 0;
  do {
    res_3.m_data[lVar10] = fmtInfo0.lookupBias.m_data[lVar10] * 0.5;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  FboTestUtil::Texture2DShader::setTexScaleBias(&multiTexShader,0,&res_1,&res_3);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar10 = 0;
  do {
    res_1.m_data[lVar10] = fmtInfo1.lookupScale.m_data[lVar10] * 0.5;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  res_3.m_data[2] = 0.0;
  res_3.m_data[3] = 0.0;
  lVar10 = 0;
  do {
    res_3.m_data[lVar10] = fmtInfo1.lookupBias.m_data[lVar10] * 0.5;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  FboTestUtil::Texture2DShader::setTexScaleBias(&multiTexShader,1,&res_1,&res_3);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  FboTestUtil::Texture2DShader::setUniforms(&texToFbo0Shader,pCVar6,program);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  FboTestUtil::Texture2DShader::setUniforms(&texToFbo1Shader,pCVar6,program_00);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  FboTestUtil::Texture2DShader::setUniforms(&multiTexShader,pCVar6,program_01);
  iVar11 = 1;
  local_608 = pCVar1;
  do {
    pTVar7 = &texFmt1;
    if (iVar11 == 1) {
      pTVar7 = &texFmt0;
    }
    TVar8 = glu::getTransferFormat(*pTVar7);
    dVar2 = *(deUint32 *)((long)(&this->m_tex0Size + -1) + (ulong)(iVar11 != 1) * 4);
    bVar3 = glu::isGLInternalColorFormatFilterable(dVar2);
    bVar12 = iVar11 != 1;
    pdVar9 = &fbo1;
    if (!bVar12) {
      pdVar9 = &fbo0;
    }
    textures = &tex1;
    if (!bVar12) {
      textures = &tex0;
    }
    sglr::ContextWrapper::glGenFramebuffers(pCVar1,1,pdVar9);
    sglr::ContextWrapper::glGenTextures(pCVar1,1,textures);
    sglr::ContextWrapper::glBindTexture(pCVar1,0xde1,*textures);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2801,bVar3 | 0x2600);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2800,bVar3 | 0x2600);
    sglr::ContextWrapper::glTexImage2D
              (pCVar1,0xde1,0,dVar2,(&this->m_tex0Size)[bVar12].m_data[0],
               (&this->m_tex0Size)[bVar12].m_data[1],0,TVar8.format,TVar8.dataType,(void *)0x0);
    sglr::ContextWrapper::glBindFramebuffer(pCVar1,0x8d40,*pdVar9);
    sglr::ContextWrapper::glFramebufferTexture2D(pCVar1,0x8d40,0x8ce0,0xde1,*textures,0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    this_00 = local_608;
    iVar11 = iVar11 + -1;
  } while (iVar11 == 0);
  iVar11 = 0;
  do {
    tmpTex = 0;
    bVar3 = iVar11 != 0;
    pdVar9 = &fbo1;
    if (!bVar3) {
      pdVar9 = &fbo0;
    }
    dVar2 = *pdVar9;
    res_3.m_data._0_8_ = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&res_1,(TextureFormat *)&res_3,0x80,0x80,1);
    if (iVar11 == 0) {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&res_3,(TextureLevel *)&res_1);
      local_618.m_data[0] = 0.0;
      local_618.m_data[1] = 0.0;
      local_618.m_data[2] = 0.0;
      local_618.m_data[3] = 0.0;
      lVar10 = 0;
      do {
        local_598.m_data[lVar10] = 1.0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      tcu::fillWithComponentGradients((PixelBufferAccess *)&res_3,&local_618,&local_598);
    }
    else {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&res_3,(TextureLevel *)&res_1);
      local_618.m_data[0] = 0.2;
      local_618.m_data[1] = 0.7;
      local_618.m_data[2] = 0.1;
      local_618.m_data[3] = 1.0;
      local_598.m_data[0] = 0.7;
      local_598.m_data[1] = 0.1;
      local_598.m_data[2] = 0.5;
      local_598.m_data[3] = 0.8;
      tcu::fillWithGrid((PixelBufferAccess *)&res_3,8,&local_618,&local_598);
    }
    sglr::ContextWrapper::glGenTextures(this_00,1,&tmpTex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tmpTex);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&res_3,(TextureLevel *)&res_1);
    sglr::ContextWrapper::glTexImage2D(this_00,0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,local_5b8);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,dVar2);
    sglr::ContextWrapper::glViewport
              (this_00,0,0,(&this->m_tex0Size)[bVar3].m_data[0],(&this->m_tex0Size)[bVar3].m_data[1]
              );
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    dVar2 = program_00;
    if (iVar11 == 0) {
      dVar2 = program;
    }
    res_3.m_data[0] = -1.0;
    res_3.m_data[1] = -1.0;
    res_3.m_data._8_8_ = res_3.m_data._8_8_ & 0xffffffff00000000;
    local_618.m_data._0_8_ = &DAT_3f8000003f800000;
    local_618.m_data._8_8_ = local_618.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar6,dVar2,(Vec3 *)&res_3,(Vec3 *)&local_618);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&res_1);
    pCVar1 = local_608;
    bVar3 = iVar11 == 0;
    iVar11 = iVar11 + 1;
  } while (bVar3);
  sglr::ContextWrapper::glBindFramebuffer(local_608,0x8d40,0);
  iVar11 = sglr::ContextWrapper::getWidth(pCVar1);
  iVar5 = sglr::ContextWrapper::getHeight(pCVar1);
  sglr::ContextWrapper::glViewport(pCVar1,0,0,iVar11,iVar5);
  sglr::ContextWrapper::glActiveTexture(pCVar1,0x84c0);
  sglr::ContextWrapper::glBindTexture(pCVar1,0xde1,tex0);
  sglr::ContextWrapper::glActiveTexture(pCVar1,0x84c1);
  sglr::ContextWrapper::glBindTexture(pCVar1,0xde1,tex1);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  res_1.m_data[0] = -1.0;
  res_1.m_data[1] = -1.0;
  res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
  res_3.m_data._0_8_ = &DAT_3f8000003f800000;
  res_3.m_data._8_8_ = res_3.m_data._8_8_ & 0xffffffff00000000;
  sglr::drawQuad(pCVar6,program_01,(Vec3 *)&res_1,(Vec3 *)&res_3);
  iVar11 = sglr::ContextWrapper::getWidth(pCVar1);
  iVar5 = sglr::ContextWrapper::getHeight(pCVar1);
  FboTestCase::readPixels((FboTestCase *)this,dst,0,0,iVar11,iVar5);
  FboTestUtil::Texture2DShader::~Texture2DShader(&multiTexShader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFbo1Shader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFbo0Shader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		texFmt0			= glu::mapGLInternalFormat(m_tex0Fmt);
		tcu::TextureFormat		texFmt1			= glu::mapGLInternalFormat(m_tex1Fmt);
		tcu::TextureFormatInfo	fmtInfo0		= tcu::getTextureFormatInfo(texFmt0);
		tcu::TextureFormatInfo	fmtInfo1		= tcu::getTextureFormatInfo(texFmt1);

		Texture2DShader			texToFbo0Shader	(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt0), fmtInfo0.valueMax-fmtInfo0.valueMin, fmtInfo0.valueMin);
		Texture2DShader			texToFbo1Shader	(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt1), fmtInfo1.valueMax-fmtInfo1.valueMin, fmtInfo1.valueMin);
		Texture2DShader			multiTexShader	(DataTypes() << glu::getSampler2DType(texFmt0) << glu::getSampler2DType(texFmt1), glu::TYPE_FLOAT_VEC4);

		deUint32				texToFbo0ShaderID = getCurrentContext()->createProgram(&texToFbo0Shader);
		deUint32				texToFbo1ShaderID = getCurrentContext()->createProgram(&texToFbo1Shader);
		deUint32				multiTexShaderID  = getCurrentContext()->createProgram(&multiTexShader);

		// Setup shaders
		multiTexShader.setTexScaleBias(0, fmtInfo0.lookupScale * 0.5f, fmtInfo0.lookupBias * 0.5f);
		multiTexShader.setTexScaleBias(1, fmtInfo1.lookupScale * 0.5f, fmtInfo1.lookupBias * 0.5f);
		texToFbo0Shader.setUniforms(*getCurrentContext(), texToFbo0ShaderID);
		texToFbo1Shader.setUniforms(*getCurrentContext(), texToFbo1ShaderID);
		multiTexShader.setUniforms (*getCurrentContext(), multiTexShaderID);

		// Framebuffers.
		deUint32				fbo0, fbo1;
		deUint32				tex0, tex1;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			glu::TransferFormat		transferFmt		= glu::getTransferFormat(ndx ? texFmt1 : texFmt0);
			deUint32				format			= ndx ? m_tex1Fmt : m_tex0Fmt;
			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(format);
			const IVec2&			size			= ndx ? m_tex1Size : m_tex0Size;
			deUint32&				fbo				= ndx ? fbo1 : fbo0;
			deUint32&				tex				= ndx ? tex1 : tex0;

			glGenFramebuffers(1, &fbo);
			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_2D, tex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, format, size.x(), size.y(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// Render textures to both framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			tmpTex		= 0;
			deUint32			fbo			= ndx ? fbo1 : fbo0;
			const IVec2&		viewport	= ndx ? m_tex1Size : m_tex0Size;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			if (ndx == 0)
				tcu::fillWithComponentGradients(data.getAccess(), Vec4(0.0f), Vec4(1.0f));
			else
				tcu::fillWithGrid(data.getAccess(), 8, Vec4(0.2f, 0.7f, 0.1f, 1.0f), Vec4(0.7f, 0.1f, 0.5f, 0.8f));

			glGenTextures(1, &tmpTex);
			glBindTexture(GL_TEXTURE_2D, tmpTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glViewport(0, 0, viewport.x(), viewport.y());
			sglr::drawQuad(*getCurrentContext(), ndx ? texToFbo1ShaderID : texToFbo0ShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		// Render to framebuffer.
		glBindFramebuffer(GL_FRAMEBUFFER, 0);
		glViewport(0, 0, getWidth(), getHeight());
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, tex0);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, tex1);
		sglr::drawQuad(*getCurrentContext(), multiTexShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}